

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O1

REF_STATUS ref_grid_orient_edg(REF_GRID ref_grid,REF_INT *nodes)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  REF_INT nqua;
  REF_INT ntri;
  REF_INT edg_qua;
  REF_INT edg_tri;
  REF_INT qua_nodes [27];
  REF_INT tri_nodes [27];
  undefined8 in_stack_fffffffffffffed8;
  undefined4 uVar9;
  undefined8 uVar8;
  uint local_118;
  uint local_114;
  REF_INT local_110;
  REF_INT local_10c;
  uint local_108;
  uint local_104;
  uint local_100;
  uint local_fc;
  uint local_f8;
  uint local_98;
  uint local_94;
  uint local_90;
  
  uVar9 = (undefined4)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  uVar3 = ref_cell_list_with2(ref_grid->cell[3],*nodes,nodes[1],1,(REF_INT *)&local_114,&local_10c);
  if (uVar3 == 0) {
    uVar3 = ref_cell_list_with2(ref_grid->cell[6],*nodes,nodes[1],1,(REF_INT *)&local_118,&local_110
                               );
    if (uVar3 == 0) {
      if ((int)((long)(int)local_118 + (long)(int)local_114) == 1) {
        uVar3 = local_118;
        if ((int)local_114 < (int)local_118) {
          uVar3 = local_114;
        }
        if (uVar3 == 0) {
          if (local_114 == 1) {
            uVar3 = ref_cell_nodes(ref_grid->cell[3],local_10c,(REF_INT *)&local_98);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                     ,0x47c,"ref_grid_orient_edg",(ulong)uVar3,"tri nodes");
              return uVar3;
            }
            uVar4 = *nodes;
            uVar1 = nodes[1];
            uVar2 = uVar1;
            if ((int)uVar4 < (int)uVar1) {
              uVar2 = uVar4;
            }
            uVar6 = local_94;
            if ((int)local_98 < (int)local_94) {
              uVar6 = local_98;
            }
            uVar7 = 0xffffffff;
            uVar3 = 0xffffffff;
            if (uVar2 == uVar6) {
              uVar6 = uVar1;
              if ((int)uVar1 < (int)uVar4) {
                uVar6 = uVar4;
              }
              uVar5 = local_94;
              if ((int)local_94 < (int)local_98) {
                uVar5 = local_98;
              }
              uVar7 = 0xffffffff;
              if (uVar6 == uVar5) {
                uVar7 = local_94;
              }
              uVar3 = 0xffffffff;
              if (uVar6 == uVar5) {
                uVar3 = local_98;
              }
            }
            uVar6 = local_90;
            if ((int)local_94 < (int)local_90) {
              uVar6 = local_94;
            }
            if (uVar2 == uVar6) {
              uVar6 = uVar1;
              if ((int)uVar1 < (int)uVar4) {
                uVar6 = uVar4;
              }
              uVar5 = local_90;
              if ((int)local_90 < (int)local_94) {
                uVar5 = local_94;
              }
              if (uVar6 == uVar5) {
                uVar7 = local_90;
                uVar3 = local_94;
              }
            }
            uVar6 = local_98;
            if ((int)local_90 < (int)local_98) {
              uVar6 = local_90;
            }
            if (uVar2 == uVar6) {
              if ((int)uVar1 < (int)uVar4) {
                uVar1 = uVar4;
              }
              uVar4 = local_98;
              if ((int)local_98 < (int)local_90) {
                uVar4 = local_90;
              }
              if (uVar1 == uVar4) {
                uVar7 = local_98;
                uVar3 = local_90;
              }
            }
          }
          else {
            uVar7 = 0xffffffff;
            uVar3 = 0xffffffff;
          }
          if (local_118 == 1) {
            uVar4 = ref_cell_nodes(ref_grid->cell[6],local_110,(REF_INT *)&local_108);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                     ,0x48f,"ref_grid_orient_edg",(ulong)uVar4,"qua nodes");
              return uVar4;
            }
            uVar4 = *nodes;
            uVar1 = nodes[1];
            uVar2 = uVar1;
            if ((int)uVar4 < (int)uVar1) {
              uVar2 = uVar4;
            }
            uVar6 = local_104;
            if ((int)local_108 < (int)local_104) {
              uVar6 = local_108;
            }
            if (uVar2 == uVar6) {
              uVar6 = uVar1;
              if ((int)uVar1 < (int)uVar4) {
                uVar6 = uVar4;
              }
              uVar5 = local_104;
              if ((int)local_104 < (int)local_108) {
                uVar5 = local_108;
              }
              if (uVar6 == uVar5) {
                uVar7 = local_104;
                uVar3 = local_108;
              }
            }
            uVar6 = local_100;
            if ((int)local_104 < (int)local_100) {
              uVar6 = local_104;
            }
            if (uVar2 == uVar6) {
              uVar6 = uVar1;
              if ((int)uVar1 < (int)uVar4) {
                uVar6 = uVar4;
              }
              uVar5 = local_100;
              if ((int)local_100 < (int)local_104) {
                uVar5 = local_104;
              }
              if (uVar6 == uVar5) {
                uVar7 = local_100;
                uVar3 = local_104;
              }
            }
            uVar6 = local_fc;
            if ((int)local_100 < (int)local_fc) {
              uVar6 = local_100;
            }
            if (uVar2 == uVar6) {
              uVar6 = uVar1;
              if ((int)uVar1 < (int)uVar4) {
                uVar6 = uVar4;
              }
              uVar5 = local_fc;
              if ((int)local_fc < (int)local_100) {
                uVar5 = local_100;
              }
              if (uVar6 == uVar5) {
                uVar7 = local_fc;
                uVar3 = local_100;
              }
            }
            uVar6 = local_108;
            if ((int)local_fc < (int)local_108) {
              uVar6 = local_fc;
            }
            if (uVar2 == uVar6) {
              if ((int)uVar1 < (int)uVar4) {
                uVar1 = uVar4;
              }
              uVar4 = local_108;
              if ((int)local_108 < (int)local_fc) {
                uVar4 = local_fc;
              }
              if (uVar1 == uVar4) {
                uVar7 = local_108;
                uVar3 = local_fc;
              }
            }
          }
          if (uVar3 == 0xffffffff) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   0x4ab,"ref_grid_orient_edg","node0 not found");
            uVar8 = CONCAT44(uVar9,0xffffffff);
            printf("nodes %d %d %d ntri %d nqua %d node0 %d node1 %d\n",(ulong)(uint)*nodes,
                   (ulong)(uint)nodes[1],(ulong)(uint)nodes[2],(ulong)local_114,(ulong)local_118,
                   uVar8,uVar7);
            uVar3 = 1;
            if (0 < (int)local_118) {
              printf("qua %d %d %d %d %d\n",(ulong)local_108,(ulong)local_104,(ulong)local_100,
                     (ulong)local_fc,(ulong)local_f8,uVar8,uVar7);
            }
          }
          else if (uVar7 == 0xffffffff) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   0x4ac,"ref_grid_orient_edg","node1 not found");
            uVar3 = 1;
          }
          else {
            *nodes = uVar3;
            nodes[1] = uVar7;
            uVar3 = 0;
          }
        }
        else {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                 0x477,"ref_grid_orient_edg","expect zero min tri/qua for an edge",0,
                 (long)(int)uVar3);
          uVar3 = 1;
        }
      }
      else {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
               0x476,"ref_grid_orient_edg","expect one tri/qua for an edge",1,
               (long)(int)local_118 + (long)(int)local_114);
        uVar3 = 1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x475,
             "ref_grid_orient_edg",(ulong)uVar3,"qua with edge side");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x472,
           "ref_grid_orient_edg",(ulong)uVar3,"tri with edge side");
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_grid_orient_edg(REF_GRID ref_grid, REF_INT *nodes) {
  REF_INT ntri, edg_tri, nqua, edg_qua;
  REF_INT tri_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT qua_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node0, node1;
  RSS(ref_cell_list_with2(ref_grid_tri(ref_grid), nodes[0], nodes[1], 1, &ntri,
                          &edg_tri),
      "tri with edge side");
  RSS(ref_cell_list_with2(ref_grid_qua(ref_grid), nodes[0], nodes[1], 1, &nqua,
                          &edg_qua),
      "qua with edge side");
  REIS(1, ntri + nqua, "expect one tri/qua for an edge");
  REIS(0, MIN(ntri, nqua), "expect zero min tri/qua for an edge");
  node0 = REF_EMPTY;
  node1 = REF_EMPTY;
  if (1 == ntri) {
    RSS(ref_cell_nodes(ref_grid_tri(ref_grid), edg_tri, tri_nodes),
        "tri nodes");
    if ((MIN(nodes[0], nodes[1]) == MIN(tri_nodes[0], tri_nodes[1])) &&
        (MAX(nodes[0], nodes[1]) == MAX(tri_nodes[0], tri_nodes[1]))) {
      node0 = tri_nodes[0];
      node1 = tri_nodes[1];
    }
    if ((MIN(nodes[0], nodes[1]) == MIN(tri_nodes[1], tri_nodes[2])) &&
        (MAX(nodes[0], nodes[1]) == MAX(tri_nodes[1], tri_nodes[2]))) {
      node0 = tri_nodes[1];
      node1 = tri_nodes[2];
    }
    if ((MIN(nodes[0], nodes[1]) == MIN(tri_nodes[2], tri_nodes[0])) &&
        (MAX(nodes[0], nodes[1]) == MAX(tri_nodes[2], tri_nodes[0]))) {
      node0 = tri_nodes[2];
      node1 = tri_nodes[0];
    }
  }
  if (1 == nqua) {
    RSS(ref_cell_nodes(ref_grid_qua(ref_grid), edg_qua, qua_nodes),
        "qua nodes");
    if ((MIN(nodes[0], nodes[1]) == MIN(qua_nodes[0], qua_nodes[1])) &&
        (MAX(nodes[0], nodes[1]) == MAX(qua_nodes[0], qua_nodes[1]))) {
      node0 = qua_nodes[0];
      node1 = qua_nodes[1];
    }
    if ((MIN(nodes[0], nodes[1]) == MIN(qua_nodes[1], qua_nodes[2])) &&
        (MAX(nodes[0], nodes[1]) == MAX(qua_nodes[1], qua_nodes[2]))) {
      node0 = qua_nodes[1];
      node1 = qua_nodes[2];
    }
    if ((MIN(nodes[0], nodes[1]) == MIN(qua_nodes[2], qua_nodes[3])) &&
        (MAX(nodes[0], nodes[1]) == MAX(qua_nodes[2], qua_nodes[3]))) {
      node0 = qua_nodes[2];
      node1 = qua_nodes[3];
    }
    if ((MIN(nodes[0], nodes[1]) == MIN(qua_nodes[3], qua_nodes[0])) &&
        (MAX(nodes[0], nodes[1]) == MAX(qua_nodes[3], qua_nodes[0]))) {
      node0 = qua_nodes[3];
      node1 = qua_nodes[0];
    }
  }
  RUB(REF_EMPTY, node0, "node0 not found", {
    printf("nodes %d %d %d ntri %d nqua %d node0 %d node1 %d\n", nodes[0],
           nodes[1], nodes[2], ntri, nqua, node0, node1);
    if (nqua > 0)
      printf("qua %d %d %d %d %d\n", qua_nodes[0], qua_nodes[1], qua_nodes[2],
             qua_nodes[3], qua_nodes[4]);
  });
  RUS(REF_EMPTY, node1, "node1 not found");
  /* same direction as triangle or quad side */
  nodes[0] = node0;
  nodes[1] = node1;

  return REF_SUCCESS;
}